

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O1

void helper_divw_AX_x86_64(CPUX86State *env,target_ulong t0)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  uintptr_t unaff_retaddr;
  
  if ((t0 & 0xffff) != 0) {
    uVar1 = env->regs[2];
    uVar2 = (ulong)((uint)t0 & 0xffff);
    uVar3 = (ulong)((int)uVar1 << 0x10 | (uint)env->regs[0] & 0xffff);
    uVar4 = uVar3 / uVar2;
    if ((uint)uVar4 < 0x10000) {
      env->regs[0] = uVar4 | env->regs[0] & 0xffffffffffff0000;
      env->regs[2] = uVar3 % uVar2 | uVar1 & 0xffffffffffff0000;
      return;
    }
  }
  raise_exception_ra_x86_64(env,0,unaff_retaddr);
}

Assistant:

void helper_divw_AX(CPUX86State *env, target_ulong t0)
{
    unsigned int num, den, q, r;

    num = (env->regs[R_EAX] & 0xffff) | ((env->regs[R_EDX] & 0xffff) << 16);
    den = (t0 & 0xffff);
    if (den == 0) {
        raise_exception_ra(env, EXCP00_DIVZ, GETPC());
    }
    q = (num / den);
    if (q > 0xffff) {
        raise_exception_ra(env, EXCP00_DIVZ, GETPC());
    }
    q &= 0xffff;
    r = (num % den) & 0xffff;
    env->regs[R_EAX] = (env->regs[R_EAX] & ~0xffff) | q;
    env->regs[R_EDX] = (env->regs[R_EDX] & ~0xffff) | r;
}